

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O2

void __thiscall cplus::utils::List<int_*>::forEach(List<int_*> *this,function<void_(int_*&)> *func)

{
  ListPoint *pLVar1;
  ListPoint *pLVar2;
  ListPoint *__args;
  
  if (this->listBegin != (ListPoint *)0x0) {
    pLVar2 = this->listEnd;
    __args = this->listBegin;
    do {
      std::function<void_(int_*&)>::operator()(func,&__args->value);
      pLVar1 = (ListPoint *)((ulong)pLVar2 ^ (ulong)__args->nextAndPrev);
      pLVar2 = __args;
      __args = pLVar1;
    } while (this->listBegin != pLVar1);
  }
  return;
}

Assistant:

void forEach(const std::function<void(T &)> &func) const {
				auto state = listBegin;
				auto preview = listEnd;
				if (state != nullptr) {
					do {
						func(state->get());
						auto next = state->next(preview);
						preview = state;
						state = next;
					} while (state != listBegin);
				}
			}